

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec.c
# Opt level: O2

size_t ecHasOrderA_deep(size_t n,size_t ec_d,size_t ec_deep,size_t m)

{
  size_t sVar1;
  
  sVar1 = ecMulA_deep(n,ec_d,ec_deep,m);
  return sVar1 + n * ec_d * 8;
}

Assistant:

size_t ecHasOrderA_deep(size_t n, size_t ec_d, size_t ec_deep, size_t m)
{
	return O_OF_W(ec_d * n) + ecMulA_deep(n, ec_d, ec_deep, m);
}